

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::IgnoreFile(cmGlobalGenerator *this,char *ext)

{
  char *pcVar1;
  byte bVar2;
  size_type sVar3;
  allocator local_61;
  key_type local_60;
  string local_40;
  char *local_20;
  char *ext_local;
  cmGlobalGenerator *this_local;
  
  local_20 = ext;
  ext_local = (char *)this;
  GetLanguageFromExtension_abi_cxx11_(&local_40,this,ext);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_40);
  pcVar1 = local_20;
  if (((bVar2 ^ 0xff) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ::count(&this->IgnoreExtensions,&local_60);
    this_local._7_1_ = sVar3 != 0;
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalGenerator::IgnoreFile(const char* ext) const
{
  if (!this->GetLanguageFromExtension(ext).empty()) {
    return false;
  }
  return (this->IgnoreExtensions.count(ext) > 0);
}